

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall Assimp::SMDImporter::SMDImporter(SMDImporter *this)

{
  SMDImporter *this_local;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0100d928;
  this->configFrameID = 0;
  memset(&this->mBuffer,0,0x18);
  std::vector<char,_std::allocator<char>_>::vector(&this->mBuffer);
  this->pScene = (aiScene *)0x0;
  this->iFileSize = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->aszTextures);
  std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::vector(&this->asTriangles);
  std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::vector(&this->asBones);
  this->iSmallestFrame = 0x7fffffff;
  this->dLengthOfAnim = 0.0;
  this->bHasUVs = false;
  this->iLineNumber = 0xffffffff;
  this->bLoadAnimationList = true;
  this->noSkeletonMesh = false;
  return;
}

Assistant:

SMDImporter::SMDImporter()
: configFrameID()
, mBuffer()
, pScene( nullptr )
, iFileSize( 0 )
, iSmallestFrame( INT_MAX )
, dLengthOfAnim( 0.0 )
, bHasUVs(false )
, iLineNumber(-1)  {
    // empty
}